

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

void __thiscall GdlGlyphClassDefn::MarkFsmClass(GdlGlyphClassDefn *this,int nPassID,int nClassID)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  value_type_conflict2 local_24;
  
  uVar1 = nPassID + 1;
  if ((ulong)(this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 < (ulong)uVar1) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->m_vfFsm,(long)(int)uVar1,false);
    std::vector<int,_std::allocator<int>_>::resize(&this->m_vnFsmID,(long)(int)uVar1,&local_24);
  }
  uVar3 = (ulong)nPassID;
  uVar4 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar4 = uVar3;
  }
  puVar2 = (this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar4 >> 6) +
           (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)nPassID & 0x3f);
  (this->m_vnFsmID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar3] = nClassID;
  return;
}

Assistant:

void GdlGlyphClassDefn::MarkFsmClass(int nPassID, int nClassID)
{
	if (m_vfFsm.size() >= unsigned(nPassID + 1))
	{
		// Once it's set it shouldn't be changed.
		Assert(!m_vfFsm[nPassID] || m_vnFsmID[nPassID] == nClassID);
	}
	else
	{
		m_vfFsm.resize(nPassID + 1, false);
		m_vnFsmID.resize(nPassID + 1, -1);
	}

	m_vfFsm[nPassID] = true;
	m_vnFsmID[nPassID] = nClassID;
}